

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

void cppurses::detail::Screen::full_paint(Widget *widg,Screen_descriptor *staged_tiles)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  size_t x;
  ulong uVar4;
  size_t y;
  size_t sVar5;
  Point local_40;
  
  paint_empty_tiles(widg);
  uVar1 = (widg->top_left_position_).x;
  sVar5 = (widg->top_left_position_).y;
  uVar3 = widg->outer_height_ + sVar5;
  sVar2 = widg->outer_width_;
  for (; uVar4 = uVar1, sVar5 < uVar3; sVar5 = sVar5 + 1) {
    for (; uVar4 < sVar2 + uVar1; uVar4 = uVar4 + 1) {
      local_40.x = uVar4;
      local_40.y = sVar5;
      full_paint_single_point(widg,staged_tiles,&local_40);
    }
  }
  return;
}

Assistant:

void Screen::full_paint(Widget& widg, const Screen_descriptor& staged_tiles)
{
    paint_empty_tiles(widg);
    const auto y_begin = widg.y();
    const auto x_begin = widg.x();
    const auto y_end   = y_begin + widg.outer_height();
    const auto x_end   = x_begin + widg.outer_width();
    for (auto y = y_begin; y < y_end; ++y) {
        for (auto x = x_begin; x < x_end; ++x) {
            full_paint_single_point(widg, staged_tiles, Point{x, y});
        }
    }
}